

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O0

void __thiscall OpenMD::RestReader::parseDumpLine(RestReader *this,string *line)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  double *pdVar5;
  element_type *this_00;
  SimInfo *pSVar6;
  long in_RDI;
  RealType RVar7;
  ObjectRestraint *oRest;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d torque;
  Vector3d force;
  Vector3d ji;
  RealType qlen;
  Vector3d vel;
  int i;
  Quat4d q;
  Vector3d pos;
  int size;
  string type;
  StuntDouble *sd;
  int index;
  int nTokens;
  StringTokenizer tokenizer;
  SquareMatrix<double,_3> *in_stack_fffffffffffffb78;
  SimInfo *in_stack_fffffffffffffb80;
  SimInfo *in_stack_fffffffffffffb88;
  SimInfo *pSVar8;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  errorStruct *in_stack_fffffffffffffb98;
  StringTokenizer *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  StuntDouble *__s;
  StringTokenizer *in_stack_fffffffffffffbc0;
  StringTokenizer *in_stack_fffffffffffffc28;
  Quaternion<double> *in_stack_fffffffffffffe08;
  undefined1 local_1b9 [49];
  Vector<double,_3U> local_188;
  Vector<double,_3U> local_170;
  Vector<double,_3U> local_158;
  double local_140;
  Vector<double,_3U> local_138;
  int local_11c;
  Vector<double,_4U> local_118;
  Vector<double,_3U> local_f8;
  int local_dc;
  string local_d8 [36];
  undefined4 local_b4;
  StuntDouble *local_b0;
  int local_a4;
  int local_a0;
  allocator<char> local_89;
  string local_88 [136];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffbc0->tokenString_,(char *)in_stack_fffffffffffffbb8,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_a0 = StringTokenizer::countTokens
                       ((StringTokenizer *)
                        CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  if (local_a0 < 2) {
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"RestReader Error: Not enough Tokens.\n%s\n",uVar3);
    painCave.isFatal = 1;
    simError();
  }
  local_a4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffba0);
  local_b0 = SimInfo::getIOIndexToIntegrableObject
                       (in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
  if (local_b0 == (StuntDouble *)0x0) {
    local_b4 = 1;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffc28);
    local_dc = std::__cxx11::string::size();
    Vector3<double>::Vector3((Vector3<double> *)0x20dd0c);
    Quaternion<double>::Quaternion((Quaternion<double> *)0x20dd1b);
    for (local_11c = 0; local_11c < local_dc; local_11c = local_11c + 1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_d8);
      switch(*puVar4) {
      case 0x66:
        Vector3<double>::Vector3((Vector3<double> *)0x20e26c);
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_170,0);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_170,1);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_170,2);
        *pdVar5 = RVar7;
        break;
      default:
        uVar3 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,"RestReader Error: %s is an unrecognized type\n",uVar3);
        painCave.isFatal = 1;
        simError();
        break;
      case 0x6a:
        Vector3<double>::Vector3((Vector3<double> *)0x20e15a);
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffb80);
        if (bVar1) {
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_3U>::operator[](&local_158,0);
          *pdVar5 = RVar7;
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_3U>::operator[](&local_158,1);
          *pdVar5 = RVar7;
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_3U>::operator[](&local_158,2);
          *pdVar5 = RVar7;
        }
        break;
      case 0x70:
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_f8,0);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_f8,1);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_f8,2);
        *pdVar5 = RVar7;
        break;
      case 0x71:
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffb80);
        if (bVar1) {
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_4U>::operator[](&local_118,0);
          *pdVar5 = RVar7;
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_4U>::operator[](&local_118,1);
          *pdVar5 = RVar7;
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_4U>::operator[](&local_118,2);
          *pdVar5 = RVar7;
          RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
          pdVar5 = Vector<double,_4U>::operator[](&local_118,3);
          *pdVar5 = RVar7;
          local_140 = Vector<double,_4U>::length((Vector<double,_4U> *)0x20e0ca);
          if (local_140 < 1e-06) {
            snprintf(painCave.errMsg,2000,
                     "RestReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n")
            ;
            painCave.isFatal = 1;
            simError();
          }
          Vector<double,_4U>::normalize((Vector<double,_4U> *)in_stack_fffffffffffffb80);
        }
        break;
      case 0x74:
        Vector3<double>::Vector3((Vector3<double> *)0x20e358);
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_188,0);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_188,1);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_188,2);
        *pdVar5 = RVar7;
        break;
      case 0x76:
        Vector3<double>::Vector3((Vector3<double> *)0x20de97);
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_138,0);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_138,1);
        *pdVar5 = RVar7;
        RVar7 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffbc0);
        pdVar5 = Vector<double,_3U>::operator[](&local_138,2);
        *pdVar5 = RVar7;
      }
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 8),(long)local_a4);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffb80,
                 (Vector3<double> *)in_stack_fffffffffffffb78);
      in_stack_fffffffffffffbc0 = (StringTokenizer *)local_1b9;
      __s = local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffbc0->tokenString_,(char *)__s,
                 (allocator<char> *)in_stack_fffffffffffffbb0);
      StuntDouble::getPropertyByName
                ((StuntDouble *)in_stack_fffffffffffffb88,(string *)in_stack_fffffffffffffb80);
      std::__cxx11::string::~string((string *)(local_1b9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1b9);
      bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb80,
                              in_stack_fffffffffffffb78);
      if (bVar1) {
        std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                  ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffb98);
        bVar1 = std::operator!=((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)
                                in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        if (bVar1) {
          this_00 = std::
                    __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::Restraint_*>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x20e54e);
          in_stack_fffffffffffffbb0 =
               (string *)SimpleTypeData<OpenMD::Restraint_*>::getData(this_00);
          if (*(Restraint **)in_stack_fffffffffffffbb0 == (Restraint *)0x0) {
            pSVar8 = in_stack_fffffffffffffb88;
            in_stack_fffffffffffffb88 = (SimInfo *)0x0;
          }
          else {
            pSVar6 = (SimInfo *)
                     __dynamic_cast(*(Restraint **)in_stack_fffffffffffffbb0,&Restraint::typeinfo,
                                    &ObjectRestraint::typeinfo,0);
            pSVar8 = in_stack_fffffffffffffb88;
            in_stack_fffffffffffffb88 = pSVar6;
          }
          if (in_stack_fffffffffffffb88 == (SimInfo *)0x0) {
            in_stack_fffffffffffffb98 = &painCave;
            snprintf(painCave.errMsg,2000,"Can not cast RestraintData to ObjectRestraint\n");
            in_stack_fffffffffffffb98->severity = 1;
            in_stack_fffffffffffffb98->isFatal = 1;
            simError();
            in_stack_fffffffffffffb88 = pSVar8;
          }
          else {
            uVar2 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffb80);
            if ((bool)uVar2) {
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffffb80,
                         (Vector3<double> *)in_stack_fffffffffffffb78);
              Quaternion<double>::toRotationMatrix3(in_stack_fffffffffffffe08);
              SquareMatrix3<double>::SquareMatrix3
                        ((SquareMatrix3<double> *)in_stack_fffffffffffffb80,
                         in_stack_fffffffffffffb78);
              ObjectRestraint::setReferenceStructure
                        ((ObjectRestraint *)CONCAT17(uVar2,in_stack_fffffffffffffb90),
                         (Vector3d *)in_stack_fffffffffffffb88,
                         (RotMat3x3d *)in_stack_fffffffffffffb80);
              SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x20e6f9);
              SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x20e706);
            }
            else {
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffffb88,
                         (Vector3<double> *)in_stack_fffffffffffffb78);
              ObjectRestraint::setReferenceStructure
                        ((ObjectRestraint *)in_stack_fffffffffffffb88,
                         (Vector3d *)in_stack_fffffffffffffb78);
              in_stack_fffffffffffffb80 = in_stack_fffffffffffffb88;
              in_stack_fffffffffffffb88 = pSVar8;
            }
          }
        }
        std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_>::~shared_ptr
                  ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> *)0x20e79c);
      }
      std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x20e7c7)
      ;
    }
    std::__cxx11::string::~string(local_d8);
    local_b4 = 0;
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffb80);
  return;
}

Assistant:

void RestReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }

    std::string type = tokenizer.nextToken();
    int size         = type.size();

    Vector3d pos;
    Quat4d q;

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        break;
      }

      case 'q': {
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not equal to 0

            snprintf(
                painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                "RestReader Error: initial quaternion error (q0^2 + q1^2 + "
                "q2^2 + "
                "q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        break;
      }
      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RestReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
      // keep the position in case we need it for a molecular restraint:

      all_pos_[index] = pos;

      // is this io restrained?
      std::shared_ptr<GenericData> data = sd->getPropertyByName("Restraint");

      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          ObjectRestraint* oRest =
              dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          } else {
            if (sd->isDirectional()) {
              oRest->setReferenceStructure(pos, q.toRotationMatrix3());
            } else {
              oRest->setReferenceStructure(pos);
            }
          }
        }
      }
    }
  }